

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

bool llvm::AArch64::getArchFeatures
               (ArchKind AK,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  pointer *ppSVar1;
  iterator __position;
  StringRef local_18;
  
  switch(AK) {
  case ARMV8_1A:
    local_18.Data = "+v8.1a";
    break;
  case ARMV8_2A:
    local_18.Data = "+v8.2a";
    break;
  case ARMV8_3A:
    local_18.Data = "+v8.3a";
    break;
  case ARMV8_4A:
    local_18.Data = "+v8.4a";
    break;
  default:
    goto switchD_001a594a_default;
  }
  local_18.Length = 6;
  __position._M_current =
       (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
    _M_realloc_insert<llvm::StringRef>(Features,__position,&local_18);
  }
  else {
    (__position._M_current)->Data = local_18.Data;
    (__position._M_current)->Length = 6;
    ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
switchD_001a594a_default:
  return AK != INVALID;
}

Assistant:

bool llvm::AArch64::getArchFeatures(AArch64::ArchKind AK,
                                    std::vector<StringRef> &Features) {
  if (AK == AArch64::ArchKind::ARMV8_1A)
    Features.push_back("+v8.1a");
  if (AK == AArch64::ArchKind::ARMV8_2A)
    Features.push_back("+v8.2a");
  if (AK == AArch64::ArchKind::ARMV8_3A)
    Features.push_back("+v8.3a");
  if (AK == AArch64::ArchKind::ARMV8_4A)
    Features.push_back("+v8.4a");

  return AK != AArch64::ArchKind::INVALID;
}